

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O0

Matrix maths::operator*(Matrix *m,double num)

{
  double **extraout_RDX;
  Matrix *in_RDI;
  double in_XMM0_Qa;
  Matrix MVar1;
  Matrix temp;
  Matrix *m_00;
  Matrix *this;
  Matrix local_28;
  double local_18;
  
  m_00 = &local_28;
  this = in_RDI;
  local_18 = in_XMM0_Qa;
  Matrix::Matrix(in_RDI,m_00);
  Matrix::operator*=(m_00,local_18);
  Matrix::Matrix(this,m_00);
  Matrix::~Matrix(this);
  MVar1.p = extraout_RDX;
  MVar1._0_8_ = in_RDI;
  return MVar1;
}

Assistant:

Matrix operator*(const Matrix& m, double num)
{
    Matrix temp(m);
    return (temp *= num);
}